

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O3

defV * __thiscall
helics::apps::SineGenerator::generate_abi_cxx11_
          (defV *__return_storage_ptr__,SineGenerator *this,Time signalTime)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  lVar4 = signalTime.internalTimeCode - (this->super_SignalGenerator).lastTime.internalTimeCode;
  lVar6 = signalTime.internalTimeCode - (this->lastCycle).internalTimeCode;
  dVar1 = (double)(lVar4 % 1000000000) * 1e-09 + (double)(lVar4 / 1000000000);
  dVar10 = this->dfdt * dVar1 + this->frequency;
  this->frequency = dVar10;
  dVar2 = dVar1 * this->dAdt + this->amplitude;
  this->amplitude = dVar2;
  dVar1 = this->level;
  dVar9 = sin(((double)(lVar6 % 1000000000) * 1e-09 + (double)(lVar6 / 1000000000)) * dVar10 *
              6.283185307179586 + this->offset);
  uVar8 = -(ulong)(0.0 < this->frequency);
  dVar10 = (double)(~uVar8 & 0x476812f9cf7920e3 | (ulong)(1.0 / this->frequency) & uVar8);
  lVar3 = (long)(dVar10 * 1000000000.0 +
                *(double *)(&DAT_0040e918 + (ulong)(0.0 <= dVar10 * 1000000000.0) * 8));
  this->period = dVar10;
  lVar4 = (this->lastCycle).internalTimeCode;
  do {
    if (dVar10 <= -9223372036.854765) {
      if (lVar6 < -0x7ffffffffffffffe) {
LAB_0020cd98:
        (this->super_SignalGenerator).lastTime.internalTimeCode = signalTime.internalTimeCode;
        *(double *)
         &(__return_storage_ptr__->
          super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
          ).
          super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          ._M_u = dVar2 * dVar9 + dVar1;
        (__return_storage_ptr__->
        super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ).
        super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
        .
        super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
        .
        super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
        .
        super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
        .
        super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
        ._M_index = '\0';
        return __return_storage_ptr__;
      }
      lVar7 = lVar6 + 0x7fffffffffffffff;
      lVar5 = -0x7fffffffffffffff;
    }
    else if ((9223372036.854765 <= dVar10) ||
            (lVar7 = lVar6 - lVar3, lVar5 = lVar3, lVar7 == 0 || lVar6 < lVar3)) goto LAB_0020cd98;
    lVar4 = lVar4 + lVar5;
    (this->lastCycle).internalTimeCode = lVar4;
    lVar6 = lVar7;
  } while( true );
}

Assistant:

defV SineGenerator::generate(Time signalTime)
    {
        auto dt = signalTime - lastTime;
        auto tdiff = signalTime - lastCycle;
        // account for the frequency shift
        frequency += dfdt * dt;
        amplitude += dAdt * dt;
        // compute the sine wave component
        double newValue = level + amplitude * sin(2.0 * pi * (frequency * tdiff) + offset);
        period = (frequency > 0.0) ? 1.0 / frequency : 1e36;
        while (tdiff > period) {
            tdiff -= period;
            lastCycle += period;
        }
        lastTime = signalTime;
        return newValue;
    }